

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNetlist.c
# Opt level: O3

Abc_Ntk_t * Abc_NtkLogicToNetlist(Abc_Ntk_t *pNtk)

{
  Abc_Obj_t *pAVar1;
  long *plVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  Abc_Ntk_t *pNtk_00;
  Abc_Obj_t *pAVar6;
  char *pcVar7;
  Abc_Obj_t *pAVar8;
  Vec_Ptr_t *pVVar9;
  Abc_Ntk_t *pAVar10;
  Vec_Ptr_t *pVVar11;
  long lVar12;
  long lVar13;
  
  if (pNtk->ntkType != ABC_NTK_LOGIC) {
    __assert_fail("Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcNetlist.c"
                  ,0x99,"Abc_Ntk_t *Abc_NtkLogicToNetlist(Abc_Ntk_t *)");
  }
  Abc_NtkCleanup(pNtk,0);
  Abc_NtkCheckUniqueCiNames(pNtk);
  Abc_NtkCheckUniqueCoNames(pNtk);
  Abc_NtkCheckUniqueCioNames(pNtk);
  iVar3 = Abc_NtkLogicHasSimpleCos(pNtk);
  if (iVar3 == 0) {
    pcVar5 = Abc_FrameReadFlag("silentmode");
    if (pcVar5 == (char *)0x0) {
      puts("Abc_NtkLogicToNetlist() warning: The network is converted to have simple COs.");
    }
    Abc_NtkLogicMakeSimpleCos(pNtk,0);
  }
  pNtk_00 = Abc_NtkStartFrom(pNtk,ABC_NTK_NETLIST,pNtk->ntkFunc);
  pVVar9 = pNtk->vCis;
  if (0 < pVVar9->nSize) {
    lVar12 = 0;
    do {
      pAVar1 = (Abc_Obj_t *)pVVar9->pArray[lVar12];
      pcVar5 = Abc_ObjName(pAVar1);
      pAVar6 = Abc_NtkFindOrCreateNet(pNtk_00,pcVar5);
      Abc_ObjAddFanin(pAVar6,(pAVar1->field_6).pCopy);
      (((pAVar1->field_6).pCopy)->field_6).pCopy = pAVar6;
      lVar12 = lVar12 + 1;
      pVVar9 = pNtk->vCis;
    } while (lVar12 < pVVar9->nSize);
  }
  pVVar9 = pNtk->vObjs;
  if (0 < pVVar9->nSize) {
    lVar12 = 0;
    do {
      pAVar1 = (Abc_Obj_t *)pVVar9->pArray[lVar12];
      if ((pAVar1 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar1->field_0x14 & 0xf) == 7)) {
        Abc_NtkDupObj(pNtk_00,pAVar1,0);
        pVVar9 = pNtk->vObjs;
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < pVVar9->nSize);
  }
  pVVar11 = pNtk->vCos;
  if (0 < pVVar11->nSize) {
    lVar12 = 0;
    do {
      pAVar1 = (Abc_Obj_t *)pVVar11->pArray[lVar12];
      pAVar6 = (Abc_Obj_t *)pAVar1->pNtk->vObjs->pArray[*(pAVar1->vFanins).pArray];
      uVar4 = *(uint *)&pAVar6->field_0x14 & 0xf;
      if (uVar4 == 2) {
LAB_001e18f5:
        pcVar5 = Abc_ObjName(pAVar6);
        pcVar7 = Abc_ObjName(pAVar1);
        iVar3 = strcmp(pcVar5,pcVar7);
        if (iVar3 != 0) {
          __assert_fail("!strcmp( Abc_ObjName(pDriver), Abc_ObjName(pObj) )",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcNetlist.c"
                        ,0xbd,"Abc_Ntk_t *Abc_NtkLogicToNetlist(Abc_Ntk_t *)");
        }
LAB_001e194c:
        Abc_ObjAddFanin((pAVar1->field_6).pCopy,(((pAVar6->field_6).pCopy)->field_6).pCopy);
      }
      else {
        if (uVar4 != 7) {
          if (uVar4 != 5) {
            __assert_fail("Abc_ObjIsNode(pDriver)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcNetlist.c"
                          ,0xc1,"Abc_Ntk_t *Abc_NtkLogicToNetlist(Abc_Ntk_t *)");
          }
          goto LAB_001e18f5;
        }
        pAVar8 = (((pAVar6->field_6).pCopy)->field_6).pCopy;
        if (pAVar8 != (Abc_Obj_t *)0x0) {
          pcVar5 = Abc_ObjName(pAVar8);
          pcVar7 = Abc_ObjName(pAVar1);
          iVar3 = strcmp(pcVar5,pcVar7);
          if (iVar3 != 0) {
            __assert_fail("!strcmp( Abc_ObjName(pDriver->pCopy->pCopy), Abc_ObjName(pObj) )",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcNetlist.c"
                          ,0xce,"Abc_Ntk_t *Abc_NtkLogicToNetlist(Abc_Ntk_t *)");
          }
          goto LAB_001e194c;
        }
        pcVar5 = Abc_ObjName(pAVar1);
        pAVar8 = Abc_NtkFindOrCreateNet(pNtk_00,pcVar5);
        Abc_ObjAddFanin((pAVar1->field_6).pCopy,pAVar8);
        Abc_ObjAddFanin(pAVar8,(pAVar6->field_6).pCopy);
        *(Abc_Obj_t **)((long)(pAVar6->field_6).pTemp + 0x40) = pAVar8;
      }
      lVar12 = lVar12 + 1;
      pVVar11 = pNtk->vCos;
    } while (lVar12 < pVVar11->nSize);
    pVVar9 = pNtk->vObjs;
  }
  if (0 < pVVar9->nSize) {
    lVar12 = 0;
    do {
      pAVar1 = (Abc_Obj_t *)pVVar9->pArray[lVar12];
      if (((pAVar1 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar1->field_0x14 & 0xf) == 7)) &&
         ((((pAVar1->field_6).pCopy)->field_6).pTemp == (void *)0x0)) {
        pcVar5 = Abc_ObjName(pAVar1);
        pAVar6 = Abc_NtkFindOrCreateNet(pNtk_00,pcVar5);
        Abc_ObjAddFanin(pAVar6,(pAVar1->field_6).pCopy);
        (((pAVar1->field_6).pCopy)->field_6).pCopy = pAVar6;
        pVVar9 = pNtk->vObjs;
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < pVVar9->nSize);
    if (0 < pVVar9->nSize) {
      lVar12 = 0;
      do {
        plVar2 = (long *)pVVar9->pArray[lVar12];
        if (((plVar2 != (long *)0x0) && ((*(uint *)((long)plVar2 + 0x14) & 0xf) == 7)) &&
           (0 < *(int *)((long)plVar2 + 0x1c))) {
          lVar13 = 0;
          do {
            Abc_ObjAddFanin((Abc_Obj_t *)plVar2[8],
                            *(Abc_Obj_t **)
                             (*(long *)(*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                                 (long)*(int *)(plVar2[4] + lVar13 * 4) * 8) + 0x40)
                             + 0x40));
            lVar13 = lVar13 + 1;
          } while (lVar13 < *(int *)((long)plVar2 + 0x1c));
          pVVar9 = pNtk->vObjs;
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 < pVVar9->nSize);
    }
  }
  if (pNtk->pExdc != (Abc_Ntk_t *)0x0) {
    pAVar10 = Abc_NtkToNetlist(pNtk->pExdc);
    pNtk_00->pExdc = pAVar10;
  }
  iVar3 = Abc_NtkCheck(pNtk_00);
  if (iVar3 == 0) {
    fwrite("Abc_NtkLogicToNetlist(): Network check has failed.\n",0x33,1,_stdout);
  }
  return pNtk_00;
}

Assistant:

Abc_Ntk_t * Abc_NtkLogicToNetlist( Abc_Ntk_t * pNtk )
{
    Abc_Ntk_t * pNtkNew; 
    Abc_Obj_t * pObj, * pNet, * pDriver, * pFanin;
    int i, k;

    assert( Abc_NtkIsLogic(pNtk) );

    // remove dangling nodes
    Abc_NtkCleanup( pNtk, 0 );

    // make sure the CO names are unique
    Abc_NtkCheckUniqueCiNames( pNtk );
    Abc_NtkCheckUniqueCoNames( pNtk );
    Abc_NtkCheckUniqueCioNames( pNtk );

//    assert( Abc_NtkLogicHasSimpleCos(pNtk) );
    if ( !Abc_NtkLogicHasSimpleCos(pNtk) )
    {
        if ( !Abc_FrameReadFlag("silentmode") )
            printf( "Abc_NtkLogicToNetlist() warning: The network is converted to have simple COs.\n" );
        Abc_NtkLogicMakeSimpleCos( pNtk, 0 );
    }

    // start the netlist by creating PI/PO/Latch objects
    pNtkNew = Abc_NtkStartFrom( pNtk, ABC_NTK_NETLIST, pNtk->ntkFunc );
    // create the CI nets and remember them in the new CI nodes
    Abc_NtkForEachCi( pNtk, pObj, i )
    {
        pNet = Abc_NtkFindOrCreateNet( pNtkNew, Abc_ObjName(pObj) );
        Abc_ObjAddFanin( pNet, pObj->pCopy );
        pObj->pCopy->pCopy = pNet;
    }
    // duplicate all nodes
    Abc_NtkForEachNode( pNtk, pObj, i )
        Abc_NtkDupObj(pNtkNew, pObj, 0);
    // first add the nets to the CO drivers
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        pDriver = Abc_ObjFanin0(pObj);
        if ( Abc_ObjIsCi(pDriver) )
        {
            assert( !strcmp( Abc_ObjName(pDriver), Abc_ObjName(pObj) ) );
            Abc_ObjAddFanin( pObj->pCopy, pDriver->pCopy->pCopy );
            continue;
        }
        assert( Abc_ObjIsNode(pDriver) );
        // if the CO driver has no net, create it
        if ( pDriver->pCopy->pCopy == NULL )
        {
            // create the CO net and connect it to CO
            pNet = Abc_NtkFindOrCreateNet( pNtkNew, Abc_ObjName(pObj) );
            Abc_ObjAddFanin( pObj->pCopy, pNet );
            // connect the CO net to the new driver and remember it in the new driver
            Abc_ObjAddFanin( pNet, pDriver->pCopy );
            pDriver->pCopy->pCopy = pNet;
        }
        else
        {
            assert( !strcmp( Abc_ObjName(pDriver->pCopy->pCopy), Abc_ObjName(pObj) ) );
            Abc_ObjAddFanin( pObj->pCopy, pDriver->pCopy->pCopy );
        }
    }
    // create the missing nets
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        if ( pObj->pCopy->pCopy ) // the net of the new object is already created
            continue;
        // create the new net
        pNet = Abc_NtkFindOrCreateNet( pNtkNew, Abc_ObjName(pObj) ); // here we create ridiculous names net line "n48", where 48 is the ID of the node
        Abc_ObjAddFanin( pNet, pObj->pCopy );
        pObj->pCopy->pCopy = pNet;
    }
    // connect nodes to the fanins nets
    Abc_NtkForEachNode( pNtk, pObj, i )
        Abc_ObjForEachFanin( pObj, pFanin, k )
            Abc_ObjAddFanin( pObj->pCopy, pFanin->pCopy->pCopy );
    // duplicate EXDC 
    if ( pNtk->pExdc )
        pNtkNew->pExdc = Abc_NtkToNetlist( pNtk->pExdc );
    if ( !Abc_NtkCheck( pNtkNew ) )
        fprintf( stdout, "Abc_NtkLogicToNetlist(): Network check has failed.\n" );
    return pNtkNew;
}